

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,FixedArray<char,_1UL> *params,
          ArrayPtr<const_char> *params_1)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pcVar2;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_50.ptr = (Branch *)0x1;
  local_50.size_ = *(size_t *)(params + 8);
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_50,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_38 = 1;
  uStack_30 = *(undefined8 *)(params + 8);
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_38,nums_00);
  heapString((String *)&local_50,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_50);
  Array<char>::~Array((Array<char> *)&local_50);
  local_38 = 0;
  uStack_30 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_38,nums_01);
  local_50.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_50.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_50.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_50);
  Array<kj::StringTree::Branch>::~Array(&local_50);
  pcVar2 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->text).content.ptr;
  }
  *pcVar2 = (char)this->size_;
  kj::_::fill<kj::ArrayPtr<char_const>>(pcVar2 + 1,(ArrayPtr<const_char> *)params);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}